

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

void * QTest::fetchData(QTestData *data,char *tagName,int typeId)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QTestTable *pQVar5;
  char *pcVar6;
  void *pvVar7;
  int in_EDX;
  QTestTable *in_RSI;
  QTestData *in_RDI;
  long in_FS_OFFSET;
  int idx;
  char *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  QMetaType local_58;
  QMetaType local_50;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    qt_assert("typeId",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestcase.cpp"
              ,0x573);
  }
  if (in_RDI == (QTestData *)0x0) {
    qt_assert_x("QTest::fetchData()","Test data requested, but no testdata available.",
                "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestcase.cpp"
                ,0x574);
  }
  pQVar5 = QTestData::parent(in_RDI);
  if (pQVar5 == (QTestTable *)0x0) {
    qt_assert("data->parent()",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestcase.cpp"
              ,0x575);
  }
  QTestData::parent(in_RDI);
  iVar2 = QTestTable::indexOf(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffff90));
  bVar1 = true;
  if (iVar2 != -1) {
    iVar3 = QTestData::dataCount(in_RDI);
    bVar1 = iVar3 <= iVar2;
  }
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,iVar4,in_stack_ffffffffffffff68);
    QMessageLogger::fatal
              (local_28,
               "QFETCH: Requested testdata \'%s\' not available, check your _data function.",in_RSI)
    ;
  }
  iVar2 = in_EDX;
  QTestData::parent(in_RDI);
  iVar3 = QTestTable::elementTypeId
                    ((QTestTable *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (in_EDX != iVar3) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,iVar4,in_stack_ffffffffffffff68);
    QMetaType::QMetaType(&local_50,iVar2);
    in_stack_ffffffffffffff78 = QMetaType::name(&local_50);
    QTestData::parent(in_RDI);
    iVar4 = QTestTable::elementTypeId
                      ((QTestTable *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
                       (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QMetaType::QMetaType(&local_58,iVar4);
    pcVar6 = QMetaType::name(&local_58);
    QMessageLogger::fatal
              (local_48,"Requested type \'%s\' does not match available type \'%s\'.",
               in_stack_ffffffffffffff78,pcVar6);
  }
  pvVar7 = QTestData::data((QTestData *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
                           (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pvVar7;
}

Assistant:

void *fetchData(QTestData *data, const char *tagName, int typeId)
{
    QTEST_ASSERT(typeId);
    QTEST_ASSERT_X(data, "QTest::fetchData()", "Test data requested, but no testdata available.");
    QTEST_ASSERT(data->parent());

    int idx = data->parent()->indexOf(tagName);

    if (Q_UNLIKELY(idx == -1 || idx >= data->dataCount())) {
        qFatal("QFETCH: Requested testdata '%s' not available, check your _data function.",
                tagName);
    }

    if (Q_UNLIKELY(typeId != data->parent()->elementTypeId(idx))) {
        qFatal("Requested type '%s' does not match available type '%s'.",
               QMetaType(typeId).name(),
               QMetaType(data->parent()->elementTypeId(idx)).name());
    }

    return data->data(idx);
}